

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O0

int __thiscall FIX::Initiator::poll(Initiator *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  uint uVar1;
  sockaddr *__addr;
  int __fd;
  undefined8 in_XMM0_Qa;
  double timeout_local;
  Initiator *this_local;
  
  if ((this->m_firstPoll & 1U) != 0) {
    this->m_stop = false;
    (*this->_vptr_Initiator[2])(this,&this->m_settings);
    __fd = (int)this + 0x140;
    (*this->_vptr_Initiator[3])();
    connect(this,__fd,__addr,__timeout);
    this->m_firstPoll = false;
  }
  uVar1 = (*this->_vptr_Initiator[5])(in_XMM0_Qa);
  return uVar1 & 0xffffff01;
}

Assistant:

bool Initiator::poll( double timeout ) EXCEPT ( ConfigError, RuntimeError )
{
  if( m_firstPoll )
  {
    m_stop = false;
    onConfigure( m_settings );
    onInitialize( m_settings );
    connect();
    m_firstPoll = false;
  }

  return onPoll( timeout );
}